

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall TextReaderTest_InvalidFormat_Test::TestBody(TextReaderTest_InvalidFormat_Test *this)

{
  bool bVar1;
  char *message;
  StringRef line;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertionResult local_160;
  AssertHelper local_150 [2];
  undefined1 local_140 [16];
  NLHeader local_130;
  
  testing::AssertionSuccess();
  if (local_160.success_ == true) {
    local_150[0].data_ = (AssertHelperData *)local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"(input):1:1: expected format specifier","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      line.size_ = 1;
      line.data_ = "x";
      ReadHeader(&local_130,0,line);
    }
    testing::AssertionResult::operator<<
              (&local_160,
               (char (*) [97])
               "Expected: ReadHeader(0, \"x\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if (local_150[0].data_ != (AssertHelperData *)local_140) {
      operator_delete(local_150[0].data_,local_140._0_8_ + 1);
    }
  }
  testing::Message::Message((Message *)&local_130);
  if (local_160.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_160.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_150,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xdf,message);
  testing::internal::AssertHelper::operator=(local_150,(Message *)&local_130);
  testing::internal::AssertHelper::~AssertHelper(local_150);
  if ((((long *)local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ != (long *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((long *)local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ != (long *)0x0)) {
    (**(code **)(*(long *)local_130.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(TextReaderTest, InvalidFormat) {
  EXPECT_THROW_MSG(ReadHeader(0, "x"),
      ReadError, "(input):1:1: expected format specifier");
}